

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

size_t spdlog::details::os::thread_id(void)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = __tls_get_addr(&PTR_004e0d40);
  if (*(char *)(lVar1 + 0x13c8) != '\x01') {
    sVar2 = _thread_id();
    *(size_t *)(lVar1 + 0x13c0) = sVar2;
    *(undefined1 *)(lVar1 + 0x13c8) = 1;
  }
  return *(size_t *)(lVar1 + 0x13c0);
}

Assistant:

SPDLOG_INLINE size_t thread_id() SPDLOG_NOEXCEPT {
#if defined(SPDLOG_NO_TLS)
    return _thread_id();
#else  // cache thread id in tls
    static thread_local const size_t tid = _thread_id();
    return tid;
#endif
}